

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_utils.c
# Opt level: O2

char * vrna_random_string(int l,char *symbols)

{
  size_t sVar1;
  char *pcVar2;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  
  sVar1 = strlen(symbols);
  pcVar2 = (char *)vrna_alloc(l + 1);
  uVar3 = 0;
  uVar4 = 0;
  if (0 < l) {
    uVar4 = (ulong)(uint)l;
  }
  for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    dVar5 = vrna_urn();
    pcVar2[uVar3] = symbols[(int)(dVar5 * (double)(int)sVar1)];
  }
  pcVar2[l] = '\0';
  return pcVar2;
}

Assistant:

PUBLIC char *
vrna_random_string(int        l,
                   const char symbols[])
{
  char  *r;
  int   i, rn, base;

  base  = (int)strlen(symbols);
  r     = (char *)vrna_alloc(sizeof(char) * (l + 1));

  for (i = 0; i < l; i++) {
    rn    = (int)(vrna_urn() * base); /* [0, base-1] */
    r[i]  = symbols[rn];
  }
  r[l] = '\0';
  return r;
}